

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O3

bool __thiscall
cmParseDelphiCoverage::HTMLParser::initializeDelphiFile
          (HTMLParser *this,string *filename,FileLinesType *coverageVector)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  iterator iVar9;
  char cVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  beginSet;
  string line;
  ifstream in;
  int local_28c;
  ulong local_288;
  uint local_27c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_258;
  long local_238 [4];
  uint auStack_218 [122];
  
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  local_27c = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((local_27c & 5) == 0) {
    local_288 = 0;
    while( true ) {
      bVar4 = cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_258,(bool *)0x0,-1);
      if (!bVar4) break;
      lVar5 = std::__cxx11::string::find((char *)&local_258,0x53046e,0);
      cVar10 = (char)&local_258;
      lVar6 = std::__cxx11::string::find_first_not_of(cVar10,0x20);
      if ((lVar5 == -1) || (lVar5 != lVar6)) {
        lVar5 = std::__cxx11::string::find(cVar10,0x7b);
        if (lVar5 == -1) {
          lVar5 = std::__cxx11::string::find(cVar10,0x7d);
          if (lVar5 == -1) {
            lVar5 = std::__cxx11::string::find((char *)&local_258,0x530474,0);
            if ((lVar5 == -1) ||
               (local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00187be2;
            pbVar1 = local_278.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
            pcVar2 = local_278.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
            pbVar3 = local_278.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
            local_278.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != &pbVar3->field_2) {
              operator_delete(pcVar2,(pbVar3->field_2)._M_allocated_capacity + 1);
            }
            local_28c = -1;
            iVar9._M_current =
                 (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current !=
                (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_00187bb6;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (coverageVector,iVar9,&local_28c);
          }
          else {
            local_28c = -1;
            iVar9._M_current =
                 (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (coverageVector,iVar9,&local_28c);
            }
            else {
              *iVar9._M_current = -1;
              (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
LAB_00187ceb:
            local_288 = 0;
          }
        }
        else {
          local_288 = CONCAT71((int7)((ulong)lVar5 >> 8),1);
LAB_00187be2:
          bVar4 = false;
          uVar7 = std::__cxx11::string::find((char *)&local_258,0x591975,0);
          if (uVar7 != 0xffffffffffffffff) {
            uVar8 = std::__cxx11::string::find(cVar10,0x3b);
            bVar4 = uVar7 < uVar8;
          }
          if (((local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) && (local_258._M_string_length != 0)) &&
             (!bVar4 && (local_288 & 1) == 0)) {
            local_28c = 0;
            iVar9._M_current =
                 (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (coverageVector,iVar9,&local_28c);
            }
            else {
              *iVar9._M_current = 0;
              (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
            goto LAB_00187ceb;
          }
          local_28c = -1;
          iVar9._M_current =
               (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (coverageVector,iVar9,&local_28c);
          }
          else {
            *iVar9._M_current = -1;
            (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
        }
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
                   (char (*) [6])"begin");
        local_28c = -1;
        iVar9._M_current =
             (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (coverageVector,iVar9,&local_28c);
        }
        else {
LAB_00187bb6:
          local_28c = -1;
          *iVar9._M_current = -1;
          (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
      }
    }
  }
  std::ifstream::~ifstream(local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  return (local_27c & 5) == 0;
}

Assistant:

bool initializeDelphiFile(
    std::string const& filename,
    cmParseDelphiCoverage::HTMLParser::FileLinesType& coverageVector)
  {
    std::string line;
    size_t comPos;
    size_t semiPos;
    bool blockComFlag = false;
    bool lineComFlag = false;
    std::vector<std::string> beginSet;
    cmsys::ifstream in(filename.c_str());
    if (!in) {
      return false;
    }
    while (cmSystemTools::GetLineFromStream(in, line)) {
      lineComFlag = false;
      // Unique cases found in lines.
      size_t beginPos = line.find("begin");

      // Check that the begin is the first non-space string on the line
      if ((beginPos == line.find_first_not_of(' ')) &&
          beginPos != std::string::npos) {
        beginSet.emplace_back("begin");
        coverageVector.push_back(-1);
        continue;
      }
      if (line.find('{') != std::string::npos) {
        blockComFlag = true;
      } else if (line.find('}') != std::string::npos) {
        blockComFlag = false;
        coverageVector.push_back(-1);
        continue;
      } else if ((line.find("end;") != std::string::npos) &&
                 !beginSet.empty()) {
        beginSet.pop_back();
        coverageVector.push_back(-1);
        continue;
      }

      //  This checks for comments after lines of code, finding the
      //  comment symbol after the ending semicolon.
      comPos = line.find("//");
      if (comPos != std::string::npos) {
        semiPos = line.find(';');
        if (comPos < semiPos) {
          lineComFlag = true;
        }
      }
      // Based up what was found, add a line to the coverageVector
      if (!beginSet.empty() && !line.empty() && !blockComFlag &&
          !lineComFlag) {
        coverageVector.push_back(0);
      } else {
        coverageVector.push_back(-1);
      }
    }
    return true;
  }